

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollArea::AbstractScrollArea(AbstractScrollArea *this,QWidget *parent)

{
  AbstractScrollAreaPrivate *this_00;
  AbstractScrollArea *ctx;
  ConnectionType type;
  Object local_58 [8];
  Object local_50 [8];
  Object local_48 [8];
  Object local_40 [8];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  undefined1 local_28 [16];
  Object local_18 [8];
  
  QFrame::QFrame(&this->super_QFrame,parent,0);
  *(undefined ***)this = &PTR_metaObject_001a9068;
  *(undefined ***)&this->field_0x10 = &PTR__AbstractScrollArea_001a9230;
  this_00 = (AbstractScrollAreaPrivate *)operator_new(0xa8);
  ctx = this;
  AbstractScrollAreaPrivate::AbstractScrollAreaPrivate(this_00,this);
  (this->d).d = this_00;
  AbstractScrollAreaPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  type = (ConnectionType)this;
  QObject::
  connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_18,(offset_in_QTimer_to_subr)((this->d).d)->animationTimer,
             (Object *)QTimer::timeout,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_18);
  QObject::
  connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QtMWidgets::AbstractScrollArea::*)()>
            ((Object *)(local_28 + 8),(offset_in_QTimer_to_subr)((this->d).d)->startBlurAnimTimer,
             (Object *)QTimer::timeout,0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_28 + 8));
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::AbstractScrollArea::*)(int,int)>
            ((Object *)local_28,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::scroll,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            ((Object *)local_30,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::aboutToStart,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            ((Object *)local_38,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::AbstractScrollArea::*)(QVariant_const&)>
            (local_40,(offset_in_QVariantAnimation_to_subr)((this->d).d)->horBlurAnim,
             (Object *)QVariantAnimation::valueChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_48,(offset_in_QAbstractAnimation_to_subr)((this->d).d)->horBlurAnim,
             (Object *)QAbstractAnimation::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::AbstractScrollArea::*)(QVariant_const&)>
            (local_50,(offset_in_QVariantAnimation_to_subr)((this->d).d)->vertBlurAnim,
             (Object *)QVariantAnimation::valueChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::AbstractScrollArea::*)()>
            (local_58,(offset_in_QAbstractAnimation_to_subr)((this->d).d)->vertBlurAnim,
             (Object *)QAbstractAnimation::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  return;
}

Assistant:

AbstractScrollArea::AbstractScrollArea( QWidget * parent )
	:	QFrame( parent )
	,	d( new AbstractScrollAreaPrivate( this ) )
{
	d->init();

	connect( d->animationTimer, &QTimer::timeout,
		this, &AbstractScrollArea::_q_animateScrollIndicators );

	connect( d->startBlurAnimTimer, &QTimer::timeout,
		this, &AbstractScrollArea::_q_startBlurAnim );

	connect( d->scroller, &Scroller::scroll,
		this, &AbstractScrollArea::_q_kineticScrolling );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &AbstractScrollArea::_q_kineticScrollingAboutToStart );

	connect( d->scroller, &Scroller::finished,
		this, &AbstractScrollArea::_q_kineticScrollingFinished );

	connect( d->horBlurAnim, &QVariantAnimation::valueChanged,
		this, &AbstractScrollArea::_q_horBlurAnim );

	connect( d->horBlurAnim, &QVariantAnimation::finished,
		this, &AbstractScrollArea::_q_horBlurAnimFinished );

	connect( d->vertBlurAnim, &QVariantAnimation::valueChanged,
		this, &AbstractScrollArea::_q_vertBlurAnim );

	connect( d->vertBlurAnim, &QVariantAnimation::finished,
		this, &AbstractScrollArea::_q_vertBlurAnimFinished );
}